

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O1

int solvePlain(char *filename)

{
  int iVar1;
  undefined4 *puVar2;
  long lVar3;
  HModel model;
  HDual solver;
  HModel aHStack_15cb0 [4000];
  undefined8 auStack_14d10 [62];
  HDual HStack_14b20;
  
  HModel::HModel(aHStack_15cb0);
  iVar1 = HModel::load_fromMPS((char *)aHStack_15cb0);
  if (iVar1 == 0) {
    HModel::scaleModel();
    lVar3 = 0x8a8;
    do {
      memset((void *)((long)&HStack_14b20.dual_variant + lVar3),0,0xa8);
      lVar3 = lVar3 + 0xb0;
    } while (lVar3 != 0x4d68);
    lVar3 = 0x4de8;
    do {
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 400) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x198) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x180) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x188) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x170) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x178) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1b0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1b8) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1c0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1c8) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1d0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1d8) = 0;
      *(undefined8 *)((long)&HStack_14b20.dual_variant + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.Crash_Mode + lVar3) = 0;
      *(undefined8 *)(&HStack_14b20.SolveBailout + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.TimeLimitValue + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.totalRebuilds + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.totalRebuildTime + lVar3) = 0;
      lVar3 = lVar3 + 0xb8;
    } while (lVar3 != 0x95c8);
    lVar3 = 0x9578;
    do {
      puVar2 = (undefined4 *)((long)&HStack_14b20.dual_variant + lVar3);
      *puVar2 = 0;
      *(undefined8 *)((long)&HStack_14b20.Crash_Mode + lVar3) = 0;
      *(undefined4 **)(&HStack_14b20.SolveBailout + lVar3) = puVar2;
      *(undefined4 **)((long)&HStack_14b20.TimeLimitValue + lVar3) = puVar2;
      *(undefined8 *)((long)&HStack_14b20.totalRebuilds + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.n_dvx_fwk + lVar3) = 0;
      *(undefined8 *)(&HStack_14b20.nw_dvx_fwk + lVar3) = 0;
      *(undefined8 *)
       ((long)&HStack_14b20.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + lVar3) = 0;
      *(undefined8 *)
       ((long)&HStack_14b20.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + lVar3 + 8) = 0;
      *(undefined8 *)
       ((long)&HStack_14b20.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + lVar3 + 0x10) = 0;
      *(undefined8 *)(&HStack_14b20.iz_DSE_wt + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.numTot + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.matrix + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.factor + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.jMove + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.workRange + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.baseLower + lVar3) = 0;
      lVar3 = lVar3 + 0xe8;
    } while (lVar3 != 0xf018);
    lVar3 = 0xf228;
    do {
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x20) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x28) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x10) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x18) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 8) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x40) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x48) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x50) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x58) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x60) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x68) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x80) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x88) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x90) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x98) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0xa0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0xa8) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0xb8) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0xc0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 200) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0xd0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0xd8) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0xe0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0xf8) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x100) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x108) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x110) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x118) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x120) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x158) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x160) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x148) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x150) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x138) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x140) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 400) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x198) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x180) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x188) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x170) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x178) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1b0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1b8) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1c0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1c8) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1d0) = 0;
      *(undefined8 *)((long)auStack_14d10 + lVar3 + 0x1d8) = 0;
      *(undefined8 *)((long)&HStack_14b20.dual_variant + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.Crash_Mode + lVar3) = 0;
      *(undefined8 *)(&HStack_14b20.SolveBailout + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.TimeLimitValue + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.totalRebuilds + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.totalRebuildTime + lVar3) = 0;
      lVar3 = lVar3 + 0x260;
    } while (lVar3 != 0x13e28);
    lVar3 = 0x13c08;
    do {
      *(undefined8 *)((long)&HStack_14b20.dual_variant + lVar3) = 0;
      *(undefined8 *)((long)&HStack_14b20.Crash_Mode + lVar3) = 0;
      *(undefined8 *)(&HStack_14b20.SolveBailout + lVar3) = 0;
      lVar3 = lVar3 + 0x78;
    } while (lVar3 != 0x14b08);
    HDual::solve((HModel *)&HStack_14b20,(int)aHStack_15cb0,0);
    HModel::util_reportSolverOutcome((char *)aHStack_15cb0);
    HModel::util_reportModelDense();
    HDual::~HDual(&HStack_14b20);
    iVar1 = 0;
  }
  HModel::~HModel(aHStack_15cb0);
  return iVar1;
}

Assistant:

int solvePlain(const char *filename) {
  HModel model;
  //  model.intOption[INTOPT_PRINT_FLAG] = 1;
    int RtCd = model.load_fromMPS(filename);
  //  int RtCd = model.load_fromToy(filename);
  if (RtCd) return RtCd;
  
  model.scaleModel();
  HDual solver;
  solver.solve(&model);
  model.util_reportSolverOutcome("Solve plain");
#ifdef JAJH_dev
  model.util_reportModelDense();
  //Possibly analyse the degeneracy of the primal and dual activities
  //  model.util_anPrDuDgn();
#endif
  //  model.util_reportModel();
  //model.util_reportModelSolution();
  return 0;
}